

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

string * __thiscall
duckdb::Exception::ConstructMessage<std::__cxx11::string,unsigned_long,unsigned_long>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          unsigned_long params_1,unsigned_long params_2)

{
  pointer *ppEVar1;
  pointer pcVar2;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  _Alloc_hider params_1_00;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> local_48;
  
  params_1_00._M_p = (pointer)0x0;
  ppEVar1 = &local_48.
             super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcVar2 = (msg->_M_dataplus)._M_p;
  local_48.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)ppEVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + msg->_M_string_length);
  ConstructMessageRecursive<std::__cxx11::string,unsigned_long,unsigned_long>
            (__return_storage_ptr__,this,(string *)&stack0xffffffffffffff98,&local_48,params,
             params_1,(unsigned_long)params_1_00._M_p);
  if (local_48.
      super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppEVar1) {
    operator_delete(local_48.
                    super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          &stack0xffffffffffffff98);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}